

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O0

int CfdDecryptAES(void *handle,char *key,char *cbc_iv,char *buffer,char **output)

{
  bool bVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  undefined8 *in_R8;
  CfdException *except;
  exception *std_except;
  ByteData aes_data_1;
  ByteData iv;
  ByteData aes_data;
  ByteData data;
  ByteData key_data;
  string *in_stack_fffffffffffffd50;
  undefined8 in_stack_fffffffffffffd58;
  CfdError error_code;
  CfdException *in_stack_fffffffffffffd60;
  allocator *paVar4;
  string *in_stack_fffffffffffffda0;
  string local_230;
  ByteData local_210;
  allocator local_1f1;
  string local_1f0;
  ByteData local_1d0;
  string local_1b8;
  ByteData local_198;
  allocator local_179;
  string local_178;
  ByteData local_158;
  allocator local_139;
  string local_138;
  ByteData local_118;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [32];
  CfdSourceLocation local_d8;
  undefined1 local_ba;
  allocator local_b9;
  string local_b8 [32];
  CfdSourceLocation local_98;
  undefined1 local_7a;
  allocator local_79;
  string local_78 [32];
  CfdSourceLocation local_58;
  undefined8 *local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffd58 >> 0x20);
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_18 == (char *)0x0) {
    local_58.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                 ,0x2f);
    local_58.filename = local_58.filename + 1;
    local_58.line = 0x301;
    local_58.funcname = "CfdDecryptAES";
    cfd::core::logger::warn<>(&local_58,"key is null.");
    local_7a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"Failed to parameter. key is null.",&local_79);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd60,error_code,in_stack_fffffffffffffd50);
    local_7a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_28 == (char *)0x0) {
    local_98.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                 ,0x2f);
    local_98.filename = local_98.filename + 1;
    local_98.line = 0x307;
    local_98.funcname = "CfdDecryptAES";
    cfd::core::logger::warn<>(&local_98,"buffer is null.");
    local_ba = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Failed to parameter. buffer is null.",&local_b9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd60,error_code,in_stack_fffffffffffffd50);
    local_ba = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_30 == (undefined8 *)0x0) {
    local_d8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_common.cpp"
                 ,0x2f);
    local_d8.filename = local_d8.filename + 1;
    local_d8.line = 0x30d;
    local_d8.funcname = "CfdDecryptAES";
    cfd::core::logger::warn<>(&local_d8,"output is null.");
    local_fa = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,"Failed to parameter. output is null.",&local_f9);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffd60,error_code,in_stack_fffffffffffffd50);
    local_fa = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_138,local_18,&local_139);
  cfd::core::ByteData::ByteData(&local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator((allocator<char> *)&local_139);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,local_28,&local_179);
  cfd::core::ByteData::ByteData(&local_158,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  bVar1 = cfd::capi::IsEmptyString(local_20);
  if (bVar1) {
    cfd::core::CryptoUtil::DecryptAes256(&local_198,&local_118,&local_158);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_1b8,&local_198);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffda0);
    *local_30 = pcVar3;
    std::__cxx11::string::~string((string *)&local_1b8);
    cfd::core::ByteData::~ByteData((ByteData *)0x579235);
  }
  else {
    paVar4 = &local_1f1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1f0,local_20,paVar4);
    cfd::core::ByteData::ByteData(&local_1d0,&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
    cfd::core::CryptoUtil::DecryptAes256Cbc(&local_210,&local_118,&local_1d0,&local_158);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_230,&local_210);
    pcVar3 = cfd::capi::CreateString(in_stack_fffffffffffffda0);
    *local_30 = pcVar3;
    std::__cxx11::string::~string((string *)&local_230);
    cfd::core::ByteData::~ByteData((ByteData *)0x579413);
    cfd::core::ByteData::~ByteData((ByteData *)0x579420);
  }
  local_4 = 0;
  cfd::core::ByteData::~ByteData((ByteData *)0x5794ef);
  cfd::core::ByteData::~ByteData((ByteData *)0x5794fc);
  return local_4;
}

Assistant:

int CfdDecryptAES(
    void* handle, const char* key, const char* cbc_iv, const char* buffer,
    char** output) {
  try {
    cfd::Initialize();
    if (key == nullptr) {
      warn(CFD_LOG_SOURCE, "key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. key is null.");
    }
    if (buffer == nullptr) {
      warn(CFD_LOG_SOURCE, "buffer is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. buffer is null.");
    }
    if (output == nullptr) {
      warn(CFD_LOG_SOURCE, "output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. output is null.");
    }
    ByteData key_data(key);
    ByteData data(buffer);

    if (cfd::capi::IsEmptyString(cbc_iv)) {
      auto aes_data = cfd::core::CryptoUtil::DecryptAes256(key_data, data);
      *output = cfd::capi::CreateString(aes_data.GetHex());
    } else {
      ByteData iv(cbc_iv);
      auto aes_data =
          cfd::core::CryptoUtil::DecryptAes256Cbc(key_data, iv, data);
      *output = cfd::capi::CreateString(aes_data.GetHex());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return cfd::capi::SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    cfd::capi::SetLastFatalError(handle, std_except.what());
  } catch (...) {
    cfd::capi::SetLastFatalError(handle, "unknown error.");
  }
  return CfdErrorCode::kCfdUnknownError;
}